

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FieldOptions::ByteSizeLong(FieldOptions *this)

{
  bool bVar1;
  uint uVar2;
  FieldOptions_CType value;
  FieldOptions_JSType value_00;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  UninterpretedOption *value_01;
  uint local_40;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  FieldOptions *this_local;
  
  _i = internal::ExtensionSet::ByteSize(&this->_extensions_);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FieldOptions::unknown_fields(this);
    sVar4 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
    _i = sVar4 + _i;
  }
  uVar2 = uninterpreted_option_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
    value_01 = uninterpreted_option(this,local_40);
    sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value_01);
    _i = sVar4 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_ctype(this);
    if (bVar1) {
      value = ctype(this);
      sVar4 = internal::WireFormatLite::EnumSize(value);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_packed(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_lazy(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_deprecated(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_weak(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_jstype(this);
    if (bVar1) {
      value_00 = jstype(this);
      sVar4 = internal::WireFormatLite::EnumSize(value_00);
      _i = sVar4 + 1 + _i;
    }
  }
  iVar3 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t FieldOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (has_ctype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->ctype());
    }

    // optional bool packed = 2;
    if (has_packed()) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (has_lazy()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional bool weak = 10 [default = false];
    if (has_weak()) {
      total_size += 1 + 1;
    }

    // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
    if (has_jstype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->jstype());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}